

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O3

void __thiscall
QSharedDataPointer<QOpenGLPixelTransferOptionsData>::detach_helper
          (QSharedDataPointer<QOpenGLPixelTransferOptionsData> *this)

{
  QOpenGLPixelTransferOptionsData *pQVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  QOpenGLPixelTransferOptionsData *pQVar7;
  
  pQVar7 = (QOpenGLPixelTransferOptionsData *)operator_new(0x20);
  pQVar1 = (this->d).ptr;
  (pQVar7->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> = (__atomic_base<int>)0x0;
  iVar3 = pQVar1->alignment;
  iVar4 = pQVar1->skipImages;
  iVar5 = pQVar1->skipRows;
  iVar6 = pQVar1->skipPixels;
  uVar2 = *(undefined8 *)((long)&pQVar1->imageHeight + 2);
  *(undefined8 *)((long)&pQVar7->skipRows + 2) = *(undefined8 *)((long)&pQVar1->skipRows + 2);
  *(undefined8 *)((long)&pQVar7->imageHeight + 2) = uVar2;
  pQVar7->alignment = iVar3;
  pQVar7->skipImages = iVar4;
  pQVar7->skipRows = iVar5;
  pQVar7->skipPixels = iVar6;
  LOCK();
  (pQVar7->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pQVar7->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  pQVar1 = (this->d).ptr;
  LOCK();
  (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + -1);
  UNLOCK();
  if ((__int_type)
      (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int> == 0) {
    operator_delete((this->d).ptr,0x20);
  }
  (this->d).ptr = pQVar7;
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QSharedDataPointer<T>::detach_helper()
{
    T *x = clone();
    x->ref.ref();
    if (!d.get()->ref.deref())
        delete d.get();
    d.reset(x);
}